

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

int __thiscall FNodeBuilder::Heuristic(FNodeBuilder *this,node_t *node,DWORD set,bool honorNoSplit)

{
  int *piVar1;
  FPrivVert *pFVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  TArray<int,_int> *this_00;
  ulong uVar11;
  FPrivSeg *seg;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_5c;
  TArray<int,_int> *local_58;
  TArray<int,_int> *local_50;
  ulong local_48;
  node_t *local_40;
  int sidev [2];
  
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  local_50 = &this->Touched;
  local_40 = node;
  TArray<int,_int>::Clear(local_50);
  local_58 = &this->Colinear;
  TArray<int,_int>::Clear(local_58);
  iVar10 = 1000000;
  local_48 = 0;
  local_5c = (int)CONCAT71(in_register_00000009,honorNoSplit);
  uVar9 = 0;
LAB_00470f06:
  if (set == 0xffffffff) {
    iVar5 = 0;
    if (local_68._4_4_ != 0 && (int)local_68 != 0) {
      if ((local_70._4_4_ != 0 && (int)local_70 != 0) &&
         (((byte)local_5c == '\0' ||
          (((int)local_78 != (int)local_70 && (local_78._4_4_ != local_70._4_4_)))))) {
        uVar6 = (ulong)(this->Touched).Count;
        uVar4 = (this->Colinear).Count;
        if (uVar6 == 0 || (ulong)uVar4 != 0) {
          uVar8 = 0;
          do {
            if (uVar8 == uVar6) {
              if ((local_40->dx == 0) || (local_40->dy == 0)) {
                if ((local_48 & 1) == 0) {
                  iVar10 = iVar10 + (uVar9 >> 4);
                }
                else {
                  iVar10 = iVar10 + uVar9 * 8;
                }
              }
              iVar7 = (int)local_68 - local_68._4_4_;
              iVar5 = -iVar7;
              if (iVar7 < 1) {
                iVar5 = iVar7;
              }
              return iVar10 + local_68._4_4_ + (int)local_68 + iVar5;
            }
            uVar11 = 0;
            while( true ) {
              if (uVar4 == uVar11) goto LAB_0047122c;
              if (local_50->Array[uVar8] == local_58->Array[uVar11]) break;
              uVar11 = uVar11 + 1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar4 != (uint)uVar11);
        }
      }
LAB_0047122c:
      iVar5 = -1;
    }
    return iVar5;
  }
  seg = (this->Segs).Array + set;
  uVar6 = 1;
  if (this->HackSeg == set) {
LAB_00470f5b:
    iVar5 = seg->loopnum;
    if ((iVar5 != 0 && honorNoSplit) && (sidev[1] == 0 || sidev[0] == 0)) {
      if (sidev[1] == 0 && sidev[0] == 0) {
        uVar4 = (this->Colinear).Count;
        for (uVar8 = 0; this_00 = local_58, uVar4 != uVar8; uVar8 = uVar8 + 1) {
          if ((this->Colinear).Array[uVar8] == iVar5) goto LAB_00471182;
        }
      }
      else {
        uVar4 = (this->Touched).Count;
        for (uVar8 = 0; this_00 = local_50, uVar4 != uVar8; uVar8 = uVar8 + 1) {
          if ((this->Touched).Array[uVar8] == iVar5) goto LAB_00471182;
        }
      }
      goto LAB_00471186;
    }
    goto LAB_0047118f;
  }
  pFVar2 = (this->Vertices).Array;
  uVar4 = ClassifyLine2(local_40,&pFVar2[seg->v1].super_FSimpleVert,
                        &pFVar2[seg->v2].super_FSimpleVert,sidev);
  uVar6 = (ulong)uVar4;
  if (uVar4 < 2) goto LAB_00470f5b;
  bVar12 = seg->loopnum != 0;
  if (((byte)local_5c & bVar12) == 0) {
    dVar13 = InterceptVector(this,local_40,seg);
    if ((dVar13 < 0.001) || (0.999 < dVar13)) {
      pFVar2 = (this->Vertices).Array;
      dVar18 = (double)pFVar2[seg->v1].super_FSimpleVert.x;
      dVar17 = (double)pFVar2[seg->v1].super_FSimpleVert.y;
      dVar16 = (double)pFVar2[seg->v2].super_FSimpleVert.x;
      dVar14 = (dVar16 - dVar18) * dVar13 + dVar18;
      dVar15 = (double)pFVar2[seg->v2].super_FSimpleVert.y;
      dVar3 = (dVar15 - dVar17) * dVar13 + dVar17;
      if (((ABS(dVar14 - dVar18) < 7.0) && (ABS(dVar3 - dVar17) < 7.0)) ||
         ((ABS(dVar14 - dVar16) < 7.0 && (ABS(dVar3 - dVar15) < 7.0)))) goto LAB_0047122c;
      iVar10 = iVar10 - (int)(1.0 / (double)(~-(ulong)(0.999 < dVar13) & (ulong)dVar13 |
                                            (ulong)(1.0 - dVar13) & -(ulong)(0.999 < dVar13)));
      if (iVar10 < 2) {
        iVar10 = 1;
      }
    }
    local_48 = CONCAT71((int7)(local_48 >> 8),(byte)local_48 | bVar12);
    local_68 = CONCAT44((int)((ulong)local_68 >> 0x20) + 1,(int)local_68 + 1);
    if ((seg->linedef != -1) &&
       (local_70 = CONCAT44((int)((ulong)local_70 >> 0x20) + 1,(int)local_70 + 1),
       seg->frontsector == seg->backsector)) {
      local_78 = CONCAT44((int)((ulong)local_78 >> 0x20) + 1,(int)local_78 + 1);
    }
    goto LAB_004711b7;
  }
  goto LAB_0047122c;
LAB_00471182:
  if (uVar4 == (uint)uVar8) {
LAB_00471186:
    TArray<int,_int>::Push(this_00,&seg->loopnum);
  }
LAB_0047118f:
  piVar1 = (int *)((long)&local_68 + uVar6 * 4);
  *piVar1 = *piVar1 + 1;
  if (seg->linedef == -1) {
    iVar10 = iVar10 + 2;
  }
  else {
    piVar1 = (int *)((long)&local_70 + uVar6 * 4);
    *piVar1 = *piVar1 + 1;
    if (seg->frontsector == seg->backsector) {
      piVar1 = (int *)((long)&local_78 + uVar6 * 4);
      *piVar1 = *piVar1 + 1;
    }
    iVar10 = iVar10 + 8;
  }
LAB_004711b7:
  uVar9 = uVar9 + 1;
  set = seg->next;
  goto LAB_00470f06;
}

Assistant:

int FNodeBuilder::Heuristic (node_t &node, DWORD set, bool honorNoSplit)
{
	// Set the initial score above 0 so that near vertex anti-weighting is less likely to produce a negative score.
	int score = 1000000;
	int segsInSet = 0;
	int counts[2] = { 0, 0 };
	int realSegs[2] = { 0, 0 };
	int specialSegs[2] = { 0, 0 };
	DWORD i = set;
	int sidev[2];
	int side;
	bool splitter = false;
	unsigned int max, m2, p, q;
	double frac;

	Touched.Clear ();
	Colinear.Clear ();

	while (i != DWORD_MAX)
	{
		const FPrivSeg *test = &Segs[i];

		if (HackSeg == i)
		{
			side = 1;
		}
		else
		{
			side = ClassifyLine (node, &Vertices[test->v1], &Vertices[test->v2], sidev);
		}
		switch (side)
		{
		case 0:	// Seg is on only one side of the partition
		case 1:
			// If we don't split this line, but it abuts the splitter, also reject it.
			// The "right" thing to do in this case is to only reject it if there is
			// another nosplit seg from the same sector at this vertex. Note that a line
			// that lies exactly on top of the splitter is okay.
			if (test->loopnum && honorNoSplit && (sidev[0] == 0 || sidev[1] == 0))
			{
				if ((sidev[0] | sidev[1]) != 0)
				{
					max = Touched.Size();
					for (p = 0; p < max; ++p)
					{
						if (Touched[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Touched.Push (test->loopnum);
					}
				}
				else
				{
					max = Colinear.Size();
					for (p = 0; p < max; ++p)
					{
						if (Colinear[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Colinear.Push (test->loopnum);
					}
				}
			}

			counts[side]++;
			if (test->linedef != -1)
			{
				realSegs[side]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[side]++;
				}
				// Add some weight to the score for unsplit lines
				score += SplitCost;	
			}
			else
			{
				// Minisegs don't count quite as much for nosplitting
				score += SplitCost / 4;
			}
			break;

		default:	// Seg is cut by the partition
			// If we are not allowed to split this seg, reject this splitter
			if (test->loopnum)
			{
				if (honorNoSplit)
				{
					D(Printf (PRINT_LOG, "Splits seg %d\n", i));
					return -1;
				}
				else
				{
					splitter = true;
				}
			}

			// Splitters that are too close to a vertex are bad.
			frac = InterceptVector (node, *test);
			if (frac < 0.001 || frac > 0.999)
			{
				FPrivVert *v1 = &Vertices[test->v1];
				FPrivVert *v2 = &Vertices[test->v2];
				double x = v1->x, y = v1->y;
				x += frac * (v2->x - x);
				y += frac * (v2->y - y);
				if (fabs(x - v1->x) < VERTEX_EPSILON+1 && fabs(y - v1->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same start vertex as seg %d\n", i));
					return -1;
				}
				if (fabs(x - v2->x) < VERTEX_EPSILON+1 && fabs(y - v2->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same end vertex as seg %d\n", i));
					return -1;
				}
				if (frac > 0.999)
				{
					frac = 1 - frac;
				}
				int penalty = int(1 / frac);
				score = MAX(score - penalty, 1);
				D(Printf ("Penalized splitter by %d for being near endpt of seg %d (%f).\n", penalty, i, frac));
			}

			counts[0]++;
			counts[1]++;
			if (test->linedef != -1)
			{
				realSegs[0]++;
				realSegs[1]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[0]++;
					specialSegs[1]++;
				}
			}
			break;
		}

		segsInSet++;
		i = test->next;
	}

	// If this line is outside all the others, return a special score
	if (counts[0] == 0 || counts[1] == 0)
	{
		return 0;
	}

	// A splitter must have at least one real seg on each side.
	// Otherwise, a subsector could be left without any way to easily
	// determine which sector it lies inside.
	if (realSegs[0] == 0 || realSegs[1] == 0)
	{
		D(Printf (PRINT_LOG, "Leaves a side with only mini segs\n"));
		return -1;
	}

	// Try to avoid splits that leave only "special" segs, so that the generated
	// subsectors have a better chance of choosing the correct sector. This situation
	// is not neccesarily bad, just undesirable.
	if (honorNoSplit && (specialSegs[0] == realSegs[0] || specialSegs[1] == realSegs[1]))
	{
		D(Printf (PRINT_LOG, "Leaves a side with only special segs\n"));
		return -1;
	}

	// If this splitter intersects any vertices of segs that should not be split,
	// check if it is also colinear with another seg from the same sector. If it
	// is, the splitter is okay. If not, it should be rejected. Why? Assuming that
	// polyobject containers are convex (which they should be), a splitter that
	// is colinear with one of the sector's segs and crosses the vertex of another
	// seg of that sector must be crossing the container's corner and does not
	// actually split the container.

	max = Touched.Size ();
	m2 = Colinear.Size ();

	// If honorNoSplit is false, then both these lists will be empty.

	// If the splitter touches some vertices without being colinear to any, we
	// can skip further checks and reject this right away.
	if (m2 == 0 && max > 0)
	{
		return -1;
	}

	for (p = 0; p < max; ++p)
	{
		int look = Touched[p];
		for (q = 0; q < m2; ++q)
		{
			if (look == Colinear[q])
			{
				break;
			}
		}
		if (q == m2)
		{ // Not a good one
			return -1;
		}
	}

	// Doom maps are primarily axis-aligned lines, so it's usually a good
	// idea to prefer axis-aligned splitters over diagonal ones. Doom originally
	// had special-casing for orthogonal lines, so they performed better. ZDoom
	// does not care about the line's direction, so this is merely a choice to
	// try and improve the final tree.

	if ((node.dx == 0) || (node.dy == 0))
	{
		// If we have to split a seg we would prefer to keep unsplit, give
		// extra precedence to orthogonal lines so that the polyobjects
		// outside the entrance to MAP06 in Hexen MAP02 display properly.
		if (splitter)
		{
			score += segsInSet*8;
		}
		else
		{
			score += segsInSet/AAPreference;
		}
	}

	score += (counts[0] + counts[1]) - abs(counts[0] - counts[1]);

	return score;
}